

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  lVar2 = *state;
  lVar3 = state[4];
  uVar5 = lVar3 - lVar2;
  uVar1 = *(uint *)(this + 4);
  if (uVar5 < uVar1) {
    if (this[0x18] ==
        (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<true>>
         )0x1) {
      state[0x12] = (ulong)(lVar3 != lVar2) + lVar2;
    }
    cVar4 = '\0';
  }
  else {
    uVar6 = (ulong)*(uint *)(this + 8);
    if (uVar5 < *(uint *)(this + 8)) {
      uVar6 = uVar5;
    }
    lVar7 = *state;
    *state = uVar6 + lVar7;
    if (this[0x18] ==
        (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<true>>
         )0x1) {
      lVar8 = (ulong)(lVar3 != lVar2) + lVar2;
      lVar7 = uVar6 + lVar7;
      if (*(uint *)(this + 8) <= uVar5) {
        lVar7 = lVar8;
      }
      if (lVar2 == lVar3) {
        lVar7 = lVar8;
      }
      state[0x12] = lVar7;
    }
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    if (cVar4 == '\0') {
      cVar4 = '\0';
      do {
        if ((ulong)uVar1 + lVar2 == *state) {
          *state = lVar2;
          return (bool)cVar4;
        }
        *state = *state + -1;
        cVar4 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar4 == '\0');
    }
  }
  return (bool)cVar4;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_fast_tag) const
        {
            BidiIter const tmp = state.cur_;
            std::size_t const diff_to_end = static_cast<std::size_t>(state.end_ - tmp);

            // is there enough room?
            if(this->min_ > diff_to_end)
            {
                if(this->leading_)
                {
                    state.next_search_ = (tmp == state.end_) ? tmp : boost::next(tmp);
                }
                return false;
            }

            BidiIter const min_iter = tmp + this->min_;
            state.cur_ += (std::min)((std::size_t)this->max_, diff_to_end);

            if(this->leading_)
            {
                state.next_search_ = (diff_to_end && diff_to_end < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            for(;; --state.cur_)
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(min_iter == state.cur_)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }